

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<xilinx_do_not_care_values::MainVisitor&>
          (MinTypMaxExpression *this,AlwaysFFVisitor *visitor)

{
  Expression::visit<xilinx_do_not_care_values::MainVisitor&>(this->min_,visitor);
  Expression::visit<xilinx_do_not_care_values::MainVisitor&>(this->typ_,visitor);
  Expression::visit<xilinx_do_not_care_values::MainVisitor&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }